

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::PatchGetMethodNoFastPath
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,Var instance,PropertyId propertyId)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *scriptContext;
  RecyclableObject *pRVar3;
  PropertyRecord *pPVar4;
  undefined1 local_80 [8];
  PropertyValueInfo info;
  RecyclableObject *object;
  
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  info.inlineCacheIndex = 0;
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  BVar2 = GetPropertyObject(instance,scriptContext,(RecyclableObject **)&info.inlineCacheIndex);
  if (BVar2 == 0) {
    bVar1 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (bVar1) {
      pPVar4 = ScriptContext::GetPropertyName(scriptContext,propertyId);
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec48,(PCWSTR)(pPVar4 + 1));
    }
    pRVar3 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    local_80 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_80,functionBody,inlineCache,inlineCacheIndex,true);
    pRVar3 = (RecyclableObject *)
             PatchGetMethodFromObject
                       (instance,(RecyclableObject *)info._56_8_,propertyId,
                        (PropertyValueInfo *)local_80,scriptContext,false);
  }
  return pRVar3;
}

Assistant:

Var JavascriptOperators::PatchGetMethodNoFastPath(FunctionBody *const functionBody, InlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId)
    {
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            // Don't error if we disabled implicit calls
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined,
                    scriptContext->GetPropertyName(propertyId)->GetBuffer());
            }
            else
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
        }

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, true);
        return Js::JavascriptOperators::PatchGetMethodFromObject(instance, object, propertyId, &info, scriptContext, false);
    }